

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O2

int NgramBuilder_serialize(NgramBuilder builder,Serializer serializer,void *param)

{
  uint32_t *puVar1;
  size_t *psVar2;
  size_t *psVar3;
  char **ngram_offsets;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  uint32_t model_order;
  BuilderGram_T *pBVar8;
  ulong uVar9;
  uint32_t i;
  ulong uVar10;
  ulong uVar11;
  undefined1 local_368 [8];
  size_t next_order_offsets [64];
  BuilderGram_T cur_gram;
  size_t vocab_mem_size;
  
  puVar1 = &builder->order;
  uVar10 = 0;
  while (builder->order != uVar10) {
    psVar2 = builder->added_gram_nums + uVar10;
    psVar3 = builder->gram_nums + uVar10;
    uVar10 = uVar10 + 1;
    if (*psVar2 != *psVar3) {
      __assert_fail("builder->added_gram_nums[i] == builder->gram_nums[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c"
                    ,0x261,"int NgramBuilder_serialize(const NgramBuilder, Serializer, void *)");
    }
  }
  (*serializer)((char *)puVar1,4,param);
  lVar7 = 0;
  for (uVar10 = 0; uVar10 < *puVar1; uVar10 = uVar10 + 1) {
    (*serializer)((char *)((long)builder->gram_nums + lVar7),8,param);
    lVar7 = lVar7 + 8;
  }
  cur_gram._264_8_ = HashVocab_serialize_size(builder->vocab);
  (*serializer)((char *)&cur_gram.bow,8,param);
  HashVocab_serialize(builder->vocab,serializer,param);
  qsort(builder->ngram_offsets,builder->added_total_gram_num,8,ngram_sort_cmp);
  uVar10 = (ulong)builder->order;
  if (uVar10 == 1) {
    for (uVar4 = 0; (ulong)uVar4 < *builder->gram_nums; uVar4 = uVar4 + 1) {
      _decode_builder_gram((BuilderGram_T *)local_368,builder->ngram_offsets[uVar4]);
      local_368._0_4_ = 0xffffffff;
      serialize_builder_gram((BuilderGram_T *)local_368,builder->order,serializer,param);
    }
    pBVar8 = (BuilderGram_T *)local_368;
    next_order_offsets._252_8_ = 0xffffffffffffffff;
    model_order = *puVar1;
  }
  else {
    local_368._0_4_ = 0;
    local_368._4_4_ = 0;
    uVar9 = 1;
    while (uVar9 < uVar10) {
      sVar5 = _bsearch_order_start
                        (builder->ngram_offsets,builder->added_total_gram_num,(uint32_t)(uVar9 + 1))
      ;
      next_order_offsets[uVar9 - 1] = sVar5;
      uVar9 = uVar9 + 1;
    }
    next_order_offsets[uVar10 - 1] = builder->added_total_gram_num;
    uVar11 = 0;
    for (uVar9 = 1; uVar4 = (uint)uVar10, uVar9 < uVar10; uVar9 = uVar9 + 1) {
      uVar10 = next_order_offsets[uVar9 - 1];
      for (; iVar6 = (int)uVar10, uVar11 < uVar10; uVar11 = uVar11 + 1) {
        ngram_offsets = builder->ngram_offsets;
        pBVar8 = (BuilderGram_T *)(next_order_offsets + 0x3f);
        _decode_builder_gram(pBVar8,ngram_offsets[uVar11]);
        if (uVar9 != cur_gram.prob) {
          __assert_fail("cur_gram.order == cur_order",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c"
                        ,0x28c,"int NgramBuilder_serialize(const NgramBuilder, Serializer, void *)")
          ;
        }
        sVar5 = _bsearch_prefix_start(ngram_offsets,builder->added_total_gram_num,pBVar8);
        next_order_offsets[0x3f]._0_4_ = (int)sVar5 - iVar6;
        serialize_builder_gram(pBVar8,builder->order,serializer,param);
      }
      cur_gram.wids[uVar9 - 3] = 0xffffffff;
      cur_gram.prob = (uint32_t)uVar9;
      cur_gram.wids[0x3e] = 0xffffffff;
      cur_gram.wids[0x3f] = 0xffffffff;
      next_order_offsets[0x3f]._0_4_ = (int)next_order_offsets[uVar9] - iVar6;
      serialize_builder_gram((BuilderGram_T *)(next_order_offsets + 0x3f),*puVar1,serializer,param);
      uVar10 = (ulong)*puVar1;
    }
    if (uVar4 < 2) {
      return 0;
    }
    cur_gram.prob = uVar4;
    for (uVar4 = (uint)next_order_offsets[(ulong)(uVar4 - 1) - 1];
        (ulong)uVar4 < builder->added_total_gram_num; uVar4 = uVar4 + 1) {
      _decode_builder_gram
                ((BuilderGram_T *)(next_order_offsets + 0x3f),builder->ngram_offsets[uVar4]);
      next_order_offsets[0x3f]._0_4_ = -1;
      serialize_builder_gram
                ((BuilderGram_T *)(next_order_offsets + 0x3f),builder->order,serializer,param);
    }
    pBVar8 = (BuilderGram_T *)(next_order_offsets + 0x3f);
    cur_gram.wids[0x3e] = 0xffffffff;
    cur_gram.wids[0x3f] = 0xffffffff;
    model_order = *puVar1;
    cur_gram.wids[(ulong)(model_order - 1) - 2] = 0xffffffff;
  }
  serialize_builder_gram(pBVar8,model_order,serializer,param);
  return 0;
}

Assistant:

int NgramBuilder_serialize(const NgramBuilder builder, Serializer serializer, void* param){
    for (uint32_t i = 0;i<builder->order;i++) {
        assert(builder->added_gram_nums[i] == builder->gram_nums[i]);
    }
    serializer((char*)&builder->order,sizeof(uint32_t), param);
    for (uint32_t i = 0; i < builder->order;i++) {
        serializer((char*)&builder->gram_nums[i],sizeof(size_t), param);
    }
    size_t vocab_mem_size = HashVocab_serialize_size(builder->vocab);
    //printf("serialize vocab_mem_size:%zu\n", vocab_mem_size);
    serializer((char*)&vocab_mem_size,sizeof(vocab_mem_size), param);
    HashVocab_serialize(builder->vocab, serializer, param);

    qsort(builder->ngram_offsets, builder->added_total_gram_num, sizeof(char*), ngram_sort_cmp);
    //now sorted by order, wordids
    //print_ngrams(builder->ngram_offsets, builder->added_total_gram_num);

    if (builder->order == 1) {
        BuilderGram_T gram;
        for (uint32_t i = 0;i< builder->gram_nums[0];i++) {
            _decode_builder_gram(&gram, builder->ngram_offsets[i]);
            gram.next_arr_idx = -1;
            serialize_builder_gram(&gram, builder->order, serializer ,param);
        }
        gram.bow = -1;
        gram.prob = -1;
        serialize_builder_gram(&gram, builder->order, serializer, param);//pivot.
        return 0;
    }
    size_t cur_offset = 0;
    size_t next_order_offsets[MAX_ORDER];
    next_order_offsets[0] = 0;
    for (uint32_t cur_order = 1; cur_order< builder->order;cur_order++) {
        next_order_offsets[cur_order] = _bsearch_order_start(builder->ngram_offsets, builder->added_total_gram_num, cur_order+1);
        //printf("serialize: next_order_offsets[%d]= %zu\n", cur_order, next_order_offsets[cur_order]);
    }

    next_order_offsets[builder->order] = builder->added_total_gram_num;

    for (uint32_t cur_order = 1; cur_order < builder->order; cur_order++) {
        BuilderGram_T cur_gram;
        while (cur_offset < next_order_offsets[cur_order]) {
            _decode_builder_gram(&cur_gram, builder->ngram_offsets[cur_offset]);
            //printf("cur_order:%d\n", cur_order);
            //printf("cur_gram.order:%d\n", cur_gram.order);
            assert(cur_gram.order == cur_order);
            cur_gram.next_arr_idx = _bsearch_prefix_start(builder->ngram_offsets, builder->added_total_gram_num, &cur_gram) - next_order_offsets[cur_order];
            //if (cur_order == 1) {
            //    printf("id:%d\t", cur_offset);
            //}
            serialize_builder_gram(&cur_gram, builder->order, serializer, param); 
            cur_offset += 1;
        }
        cur_gram.wids[cur_order-1] = -1;
        cur_gram.order = cur_order;
        cur_gram.prob = -1;
        cur_gram.bow = -1;
        cur_gram.next_arr_idx = next_order_offsets[cur_order+1] - next_order_offsets[cur_order];
        serialize_builder_gram(&cur_gram, builder->order, serializer, param);
    }
    if (builder->order > 1) {
        BuilderGram_T gram;
        gram.order = builder->order;
        for (uint32_t i =  next_order_offsets[builder->order-1];i< builder->added_total_gram_num;i++) {
            _decode_builder_gram(&gram, builder->ngram_offsets[i]);
            gram.next_arr_idx = -1;
            serialize_builder_gram(&gram, builder->order, serializer, param);
        }
        gram.bow = -1;
        gram.prob = -1;
        gram.wids[builder->order-1] = -1;
        serialize_builder_gram(&gram, builder->order, serializer, param);//pivot.
    }
    return 0; 
}